

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

int recff_bit64_unary(jit_State *J,RecordFFData *rd)

{
  CTState *cts;
  CTypeID k;
  TRef TVar1;
  TRef TVar2;
  
  cts = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  k = crec_bit64_type(cts,rd->argv);
  if (k != 0) {
    TVar1 = crec_ct_tv(J,cts->tab + k,0,*J->base,rd->argv);
    (J->fold).ins.field_0.ot = (short)(rd->data << 8) + (short)k + 10;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = 0;
    TVar1 = lj_opt_fold(J);
    TVar2 = lj_ir_kint(J,k);
    (J->fold).ins.field_0.ot = 0x548a;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
    TVar1 = lj_opt_fold(J);
    *J->base = TVar1;
  }
  return (uint)(k != 0);
}

Assistant:

int LJ_FASTCALL recff_bit64_unary(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID id = crec_bit64_type(cts, &rd->argv[0]);
  if (id) {
    TRef tr = crec_ct_tv(J, ctype_get(cts, id), 0, J->base[0], &rd->argv[0]);
    tr = emitir(IRT(rd->data, id-CTID_INT64+IRT_I64), tr, 0);
    J->base[0] = emitir(IRTG(IR_CNEWI, IRT_CDATA), lj_ir_kint(J, id), tr);
    return 1;
  }
  return 0;
}